

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Locate_region(int g_a,int *lo,int *hi,int *map,int *procs)

{
  void *__ptr;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_4;
  int *pmap;
  Integer *ptmap;
  int i_3;
  int i_2;
  int i_1;
  Integer *_ga_map_capi;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  int i;
  Integer *tmap;
  Integer ndim;
  Integer np_actual;
  Integer np_guess;
  Integer a;
  logical st;
  Integer *in_stack_000003e0;
  Integer *in_stack_000003e8;
  Integer *in_stack_000003f0;
  Integer in_stack_000003f8;
  Integer *in_stack_000006f0;
  Integer *in_stack_000006f8;
  Integer *in_stack_00000700;
  Integer *in_stack_00000708;
  Integer *in_stack_00000710;
  Integer in_stack_00000718;
  int in_stack_fffffffffffffefc;
  int iVar1;
  char *in_stack_ffffffffffffff00;
  int local_ec;
  int local_e8;
  int local_e4;
  long local_d8 [8];
  long local_98 [7];
  int local_5c;
  void *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  logical local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_38 = (long)in_EDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_50 = pnga_ndim((Integer)hi);
  for (local_e4 = 0; local_e4 < local_50; local_e4 = local_e4 + 1) {
    local_98[(local_50 - local_e4) + -1] = (long)*(int *)(local_10 + (long)local_e4 * 4) + 1;
  }
  for (local_e8 = 0; local_e8 < local_50; local_e8 = local_e8 + 1) {
    local_d8[(local_50 - local_e8) + -1] = (long)*(int *)(local_18 + (long)local_e8 * 4) + 1;
  }
  local_30 = pnga_locate_nnodes(in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,
                                in_stack_000003e0);
  local_58 = malloc((long)((int)local_40 * 2 * (int)local_50 * 8));
  if (local_20 == 0) {
    GA_Error(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  __ptr = malloc(local_40 << 3);
  local_30 = pnga_locate_region(in_stack_00000718,in_stack_00000710,in_stack_00000708,
                                in_stack_00000700,in_stack_000006f8,in_stack_000006f0);
  if (local_40 == local_48) {
    if (local_30 == 0) {
      free(local_58);
      free(__ptr);
      local_4 = 0;
    }
    else {
      for (local_ec = 0; local_ec < local_48; local_ec = local_ec + 1) {
        *(int *)(local_28 + (long)local_ec * 4) =
             (int)*(undefined8 *)((long)__ptr + (long)local_ec * 8);
      }
      for (local_5c = 0; SBORROW8((long)local_5c,local_48 * 2) != (long)local_5c + local_48 * -2 < 0
          ; local_5c = local_5c + 1) {
        for (iVar1 = 0; iVar1 < local_50; iVar1 = iVar1 + 1) {
          *(int *)(local_20 + local_5c * local_50 * 4 + ((local_50 - iVar1) + -1) * 4) =
               (int)*(undefined8 *)((long)local_58 + (long)iVar1 * 8 + local_5c * local_50 * 8) + -1
          ;
        }
      }
      free(local_58);
      free(__ptr);
      local_4 = (int)local_48;
    }
    return local_4;
  }
  __assert_fail("np_guess == np_actual",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/src/capi.c"
                ,0xa74,"int NGA_Locate_region(int, int *, int *, int *, int *)");
}

Assistant:

int NGA_Locate_region(int g_a,int lo[],int hi[],int map[],int procs[])
{
     logical st;
     Integer a=(Integer)g_a, np_guess, np_actual;
     Integer ndim = wnga_ndim(a);
     Integer *tmap;
     int i;
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     Integer *_ga_map_capi;
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);
     st = wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np_guess);
     tmap = (Integer *)malloc( (int)(np_guess*2*ndim *sizeof(Integer)));
     if(!map)GA_Error("NGA_Locate_region: unable to allocate memory",g_a);
     _ga_map_capi = (Integer*)malloc(np_guess*sizeof(Integer));

     st = wnga_locate_region(a,_ga_lo, _ga_hi, tmap, _ga_map_capi, &np_actual);
     assert(np_guess == np_actual);
     if(st==FALSE){
       free(tmap);
       free(_ga_map_capi);
       return 0;
     }

     COPY(int,_ga_map_capi,procs, np_actual);

        /* might have to swap lo/hi when copying */

     for(i=0; i< np_actual*2; i++){
        Integer *ptmap = tmap+i*ndim;
        int *pmap = map +i*ndim;
        COPYINDEX_F2C(ptmap, pmap, ndim);  
     }
     free(tmap);
     free(_ga_map_capi);
     return (int)np_actual;
}